

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O0

int secp256k1_borromean_sign
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *e0,secp256k1_scalar *s,secp256k1_gej *pubs,secp256k1_scalar *k,
              secp256k1_scalar *sec,size_t *rsizes,size_t *secidx,size_t nrings,uchar *m,size_t mlen
              )

{
  int iVar1;
  long in_RCX;
  int overflow;
  size_t size;
  size_t count;
  size_t j;
  size_t i;
  uchar tmp [33];
  secp256k1_sha256 sha256_e0;
  secp256k1_scalar ens;
  secp256k1_ge rge;
  secp256k1_gej rgej;
  secp256k1_scalar *in_stack_00000a40;
  secp256k1_scalar *in_stack_00000a48;
  secp256k1_gej *in_stack_00000a50;
  secp256k1_gej *in_stack_00000a58;
  secp256k1_ecmult_context *in_stack_00000a60;
  size_t *in_stack_fffffffffffffe08;
  size_t *size_00;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  secp256k1_ge *in_stack_fffffffffffffe18;
  secp256k1_sha256 *hash;
  secp256k1_scalar *r;
  size_t *local_1d8;
  ulong uVar2;
  secp256k1_scalar *b;
  secp256k1_scalar *in_stack_fffffffffffffe38;
  secp256k1_sha256 *in_stack_fffffffffffffe40;
  secp256k1_scalar *in_stack_fffffffffffffe48;
  secp256k1_scalar *in_stack_fffffffffffffe50;
  secp256k1_gej *in_stack_fffffffffffffe58;
  secp256k1_ge *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  uchar *in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  uchar *in_stack_fffffffffffffe98;
  uchar *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffeb0;
  secp256k1_scalar *in_stack_fffffffffffffed0;
  secp256k1_gej *in_stack_fffffffffffffed8;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffee0;
  secp256k1_gej local_b8;
  long local_28;
  
  local_28 = in_RCX;
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffe68);
  hash = (secp256k1_sha256 *)0x0;
  for (uVar2 = 0; uVar2 < j; uVar2 = uVar2 + 1) {
    secp256k1_ecmult_gen
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    secp256k1_ge_set_gej(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    iVar1 = secp256k1_gej_is_infinity(&local_b8);
    if (iVar1 != 0) {
      return 0;
    }
    secp256k1_eckey_pubkey_serialize
              (in_stack_fffffffffffffe18,
               (uchar *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08,0);
    local_1d8 = *(size_t **)(count + uVar2 * 8);
    while (local_1d8 = (size_t *)((long)local_1d8 + 1), local_1d8 < *(size_t **)(size + uVar2 * 8))
    {
      in_stack_fffffffffffffe08 = local_1d8;
      secp256k1_borromean_hash
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffeb0);
      secp256k1_scalar_set_b32
                ((secp256k1_scalar *)hash,(uchar *)in_stack_fffffffffffffe18,
                 (int *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      if ((in_stack_fffffffffffffe14 != 0) ||
         (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&stack0xfffffffffffffed0), iVar1 != 0
         )) {
        return 0;
      }
      secp256k1_ecmult(in_stack_00000a60,in_stack_00000a58,in_stack_00000a50,in_stack_00000a48,
                       in_stack_00000a40);
      iVar1 = secp256k1_gej_is_infinity(&local_b8);
      if (iVar1 != 0) {
        return 0;
      }
      secp256k1_ge_set_gej_var(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      secp256k1_eckey_pubkey_serialize
                (in_stack_fffffffffffffe18,
                 (uchar *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08,0);
    }
    secp256k1_sha256_write
              (hash,(uchar *)in_stack_fffffffffffffe18,
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    hash = (secp256k1_sha256 *)((long)hash->s + *(long *)(size + uVar2 * 8));
  }
  secp256k1_sha256_write
            (hash,(uchar *)in_stack_fffffffffffffe18,
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  secp256k1_sha256_finalize(in_stack_fffffffffffffe40,(uchar *)in_stack_fffffffffffffe38);
  r = (secp256k1_scalar *)0x0;
  b = (secp256k1_scalar *)0x0;
  do {
    if (j <= b) {
      secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffed0);
      secp256k1_ge_clear((secp256k1_ge *)0x10e089);
      secp256k1_gej_clear((secp256k1_gej *)0x10e096);
      memset(&stack0xfffffffffffffe38,0,0x21);
      return 1;
    }
    size_00 = (size_t *)0x0;
    secp256k1_borromean_hash
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffeb0);
    secp256k1_scalar_set_b32
              (r,(uchar *)in_stack_fffffffffffffe18,
               (int *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    if ((in_stack_fffffffffffffe14 != 0) ||
       (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&stack0xfffffffffffffed0), iVar1 != 0))
    {
      return 0;
    }
    for (local_1d8 = (size_t *)0x0; local_1d8 < *(ulong *)(count + (long)b * 8);
        local_1d8 = (size_t *)((long)local_1d8 + 1)) {
      secp256k1_ecmult(in_stack_00000a60,in_stack_00000a58,in_stack_00000a50,in_stack_00000a48,
                       in_stack_00000a40);
      iVar1 = secp256k1_gej_is_infinity(&local_b8);
      if (iVar1 != 0) {
        return 0;
      }
      secp256k1_ge_set_gej_var(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      secp256k1_eckey_pubkey_serialize
                (in_stack_fffffffffffffe18,
                 (uchar *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),size_00,0);
      size_00 = (size_t *)((long)local_1d8 + 1);
      secp256k1_borromean_hash
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffeb0);
      secp256k1_scalar_set_b32
                (r,(uchar *)in_stack_fffffffffffffe18,
                 (int *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      if ((in_stack_fffffffffffffe14 != 0) ||
         (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&stack0xfffffffffffffed0), iVar1 != 0
         )) {
        return 0;
      }
    }
    secp256k1_scalar_mul
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (secp256k1_scalar *)in_stack_fffffffffffffe40);
    secp256k1_scalar_negate(r,(secp256k1_scalar *)in_stack_fffffffffffffe18);
    secp256k1_scalar_add((secp256k1_scalar *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,b);
    iVar1 = secp256k1_scalar_is_zero
                      ((secp256k1_scalar *)(local_28 + ((long)r->d + (long)local_1d8) * 0x20));
    if (iVar1 != 0) {
      return 0;
    }
    r = (secp256k1_scalar *)((long)r->d + *(long *)(size + (long)b * 8));
    b = (secp256k1_scalar *)((long)b->d + 1);
  } while( true );
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_context* ecmult_ctx, const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}